

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

size_t VW_HashSpaceA(VW_HANDLE handle,char *s)

{
  size_t sVar1;
  string str;
  allocator local_51;
  long local_50;
  long local_48;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,s,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_30);
  sVar1 = (**(code **)(*(long *)((long)handle + 8) + 0x200))
                    (local_50,local_48 + local_50,*(undefined4 *)((long)handle + 0x58));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return sVar1;
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashSpaceA(VW_HANDLE handle, const char * s)
{ vw * pointer = static_cast<vw*>(handle);
  string str(s);
  return VW::hash_space(*pointer, str);
}